

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O0

void deqp::evalArrayCoordsVec3(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_40;
  undefined1 local_28 [12];
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_28,(int)c,0,1);
  tcu::operator*((tcu *)&local_1c,1.875,(Vector<float,_3> *)local_28);
  tcu::Vector<float,_4>::xyz(&local_40,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_40,&local_1c);
  return;
}

Assistant:

void evalArrayCoordsVec3(ShaderEvalContext& c)
{
	c.color.xyz() = 1.875f * c.coords.swizzle(0, 1, 2);
}